

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O2

void __thiscall
cmFindCommon::GetIgnoredPaths
          (cmFindCommon *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ignore)

{
  cmMakefile *this_00;
  char *pcVar1;
  char **ppcVar2;
  pointer path;
  allocator local_51;
  string local_50;
  
  for (ppcVar2 = GetIgnoredPaths::paths; *ppcVar2 != (char *)0x0; ppcVar2 = ppcVar2 + 1) {
    this_00 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)&local_50,*ppcVar2,&local_51);
    pcVar1 = cmMakefile::GetDefinition(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
      std::__cxx11::string::string((string *)&local_50,pcVar1,&local_51);
      cmSystemTools::ExpandListArgument(&local_50,ignore,false);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  for (path = (ignore->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
      path != (ignore->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish; path = path + 1) {
    cmsys::SystemTools::ConvertToUnixSlashes(path);
  }
  return;
}

Assistant:

void cmFindCommon::GetIgnoredPaths(std::vector<std::string>& ignore)
{
  // null-terminated list of paths.
  static const char *paths[] =
    { "CMAKE_SYSTEM_IGNORE_PATH", "CMAKE_IGNORE_PATH", 0 };

  // Construct the list of path roots with no trailing slashes.
  for(const char **pathName = paths; *pathName; ++pathName)
    {
    // Get the list of paths to ignore from the variable.
    const char* ignorePath = this->Makefile->GetDefinition(*pathName);
    if((ignorePath == 0) || (strlen(ignorePath) == 0))
      {
      continue;
      }

    cmSystemTools::ExpandListArgument(ignorePath, ignore);
    }

  for(std::vector<std::string>::iterator i = ignore.begin();
      i != ignore.end(); ++i)
    {
    cmSystemTools::ConvertToUnixSlashes(*i);
    }
}